

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t split(linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  size_t sVar4;
  ion_byte_t *piVar5;
  long lVar6;
  long lVar7;
  ion_byte_t *piVar8;
  ion_fpos_t iVar9;
  undefined8 bucket_loc_00;
  ion_err_t iVar10;
  int iVar11;
  ion_byte_t *piVar12;
  ion_byte_t *__s;
  long lVar13;
  ion_byte_t aiStack_a0 [8];
  ion_byte_t *local_98;
  ion_byte_t *local_90;
  ion_status_t local_88;
  ion_result_count_t local_80;
  ion_status_t iStack_7c;
  int num_deleted;
  char local_71;
  long lStack_70;
  ion_boolean_t terminal;
  ion_fpos_t record_offset;
  ion_byte_t *records;
  int local_58;
  int j;
  int i;
  int insert_hash_key;
  int split_hash_key;
  ion_byte_t record_status;
  ion_byte_t *record_value;
  ion_byte_t *record_key;
  linear_hash_bucket_t bucket;
  ion_fpos_t bucket_loc;
  ion_status_t status;
  linear_hash_table_t *linear_hash_local;
  
  aiStack_a0[0] = 0xda;
  aiStack_a0[1] = '\"';
  aiStack_a0[2] = '\x11';
  aiStack_a0[3] = '\0';
  aiStack_a0[4] = '\0';
  aiStack_a0[5] = '\0';
  aiStack_a0[6] = '\0';
  aiStack_a0[7] = '\0';
  bucket.overflow_location = bucket_idx_to_ion_fpos_t(linear_hash->next_split,linear_hash);
  aiStack_a0[0] = 0xef;
  aiStack_a0[1] = '\"';
  aiStack_a0[2] = '\x11';
  aiStack_a0[3] = '\0';
  aiStack_a0[4] = '\0';
  aiStack_a0[5] = '\0';
  aiStack_a0[6] = '\0';
  aiStack_a0[7] = '\0';
  linear_hash_local._7_1_ =
       linear_hash_get_bucket
                 (bucket.overflow_location,(linear_hash_bucket_t *)&record_key,linear_hash);
  if (linear_hash_local._7_1_ == '\0') {
    piVar12 = (ion_byte_t *)
              ((long)&local_98 -
              ((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0));
    lVar6 = -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0);
    _split_hash_key = piVar12 + lVar6;
    insert_hash_key._3_1_ = '\0';
    lVar7 = -(linear_hash->record_total_size * (long)linear_hash->records_per_bucket + 0xfU &
             0xfffffffffffffff0);
    __s = _split_hash_key + lVar7;
    lVar13 = linear_hash->record_total_size;
    iVar11 = linear_hash->records_per_bucket;
    record_offset = (ion_fpos_t)__s;
    record_value = piVar12;
    __s[-8] = 0x88;
    __s[-7] = '#';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    memset(__s,0,lVar13 * iVar11);
    lStack_70 = 0;
    local_71 = '\0';
    do {
      while( true ) {
        if (local_71 != '\0') {
          builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"I&\x11",4);
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar10 = linear_hash_increment_next_split(linear_hash);
          return iVar10;
        }
        if (0 < record_key._4_4_) {
          pFVar3 = (FILE *)linear_hash->database;
          lVar13 = bucket.overflow_location + 0x10;
          __s[-8] = 0xc2;
          __s[-7] = '#';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          fseek(pFVar3,lVar13,0);
          iVar9 = record_offset;
          sVar4 = linear_hash->record_total_size;
          iVar11 = linear_hash->records_per_bucket;
          pFVar3 = (FILE *)linear_hash->database;
          __s[-8] = 0xe3;
          __s[-7] = '#';
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          fread((void *)iVar9,sVar4,(long)iVar11,pFVar3);
          for (local_58 = 0; piVar8 = record_value, local_58 < record_key._4_4_;
              local_58 = local_58 + 1) {
            insert_hash_key._3_1_ = *(char *)(record_offset + lStack_70);
            lVar13 = record_offset + lStack_70;
            iVar11 = (linear_hash->super).record.key_size;
            builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"!$\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            memcpy(piVar8,(void *)(lVar13 + 1),(long)iVar11);
            piVar8 = _split_hash_key;
            lVar13 = record_offset + lStack_70;
            iVar11 = (linear_hash->super).record.key_size;
            iVar1 = (linear_hash->super).record.value_size;
            builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"I$\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            memcpy(piVar8,(void *)(lVar13 + 1 + (long)iVar11),(long)iVar1);
            piVar8 = record_value;
            builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"V$\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            j = insert_hash_to_bucket(piVar8,linear_hash);
            piVar8 = record_value;
            builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"f$\x11",4);
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            i = hash_to_bucket(piVar8,linear_hash);
            piVar8 = record_value;
            if ((insert_hash_key._3_1_ == '\x01') && (j != i)) {
              __s[-8] = 0x8f;
              __s[-7] = '$';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              iStack_7c = linear_hash_delete(piVar8,linear_hash);
              bucket_loc._0_1_ = iStack_7c.error;
              if ((char)bucket_loc != '\0') {
                return (char)bucket_loc;
              }
              bucket_loc._4_4_ = iStack_7c.count;
              local_80 = bucket_loc._4_4_;
              linear_hash->last_cache_idx = 0;
              for (records._4_4_ = 0; piVar8 = _split_hash_key, records._4_4_ < local_80;
                  records._4_4_ = records._4_4_ + 1) {
                piVar5 = linear_hash->cache;
                iVar11 = linear_hash->last_cache_idx;
                iVar1 = (linear_hash->super).record.value_size;
                iVar2 = (linear_hash->super).record.value_size;
                __s[-8] = '\0';
                __s[-7] = '%';
                __s[-6] = '\x11';
                __s[-5] = '\0';
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                memcpy(piVar8,piVar5 + iVar11 * iVar1,(long)iVar2);
                piVar8 = record_value;
                linear_hash->last_cache_idx = linear_hash->last_cache_idx + 1;
                local_98 = record_value;
                local_90 = _split_hash_key;
                builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"0%\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                iVar11 = hash_to_bucket(piVar8,linear_hash);
                piVar5 = local_90;
                piVar8 = local_98;
                builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"I%\x11",4);
                __s[-4] = '\0';
                __s[-3] = '\0';
                __s[-2] = '\0';
                __s[-1] = '\0';
                local_88 = linear_hash_insert(piVar8,piVar5,iVar11,linear_hash);
                bucket_loc._0_1_ = local_88.error;
                if ((char)bucket_loc != '\0') {
                  return (char)bucket_loc;
                }
              }
              pFVar3 = (FILE *)linear_hash->database;
              lVar13 = bucket.overflow_location + 0x10;
              __s[-8] = 0x90;
              __s[-7] = '%';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              fseek(pFVar3,lVar13,0);
              iVar9 = record_offset;
              sVar4 = linear_hash->record_total_size;
              iVar11 = linear_hash->records_per_bucket;
              pFVar3 = (FILE *)linear_hash->database;
              __s[-8] = 0xb1;
              __s[-7] = '%';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              fread((void *)iVar9,sVar4,(long)iVar11,pFVar3);
              iVar9 = bucket.overflow_location;
              __s[-8] = 0xc2;
              __s[-7] = '%';
              __s[-6] = '\x11';
              __s[-5] = '\0';
              __s[-4] = '\0';
              __s[-3] = '\0';
              __s[-2] = '\0';
              __s[-1] = '\0';
              linear_hash_get_bucket(iVar9,(linear_hash_bucket_t *)&record_key,linear_hash);
              local_58 = -1;
              lStack_70 = -linear_hash->record_total_size;
            }
            lStack_70 = linear_hash->record_total_size + lStack_70;
          }
          lStack_70 = 0;
        }
        bucket_loc_00 = bucket._0_8_;
        if (bucket._0_8_ != -1) break;
        local_71 = '\x01';
      }
      bucket.overflow_location._0_4_ = bucket.idx;
      bucket.overflow_location._4_4_ = bucket.record_count;
      builtin_memcpy(piVar12 + lVar7 + lVar6 + -8,"%&\x11",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      linear_hash_local._7_1_ =
           linear_hash_get_bucket(bucket_loc_00,(linear_hash_bucket_t *)&record_key,linear_hash);
    } while (linear_hash_local._7_1_ == '\0');
  }
  return linear_hash_local._7_1_;
}

Assistant:

ion_err_t
split(
	linear_hash_table_t *linear_hash
) {
	/* status to hold amount of records deleted */
	ion_status_t status					= ION_STATUS_INITIALIZE;

	/* get bucket to split */
	ion_fpos_t				bucket_loc	= bucket_idx_to_ion_fpos_t(linear_hash->next_split, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status.error;
	}

	/* stores for record data */
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int split_hash_key;
	int insert_hash_key;

	int			i, j;
	ion_byte_t	*records = alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false) {
		/* if the bucket is not empty */
		if (bucket.record_count > 0) {
			/* read all records into memory */
			fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
			fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

			/* scan records for records that should be placed in the new bucket */
			for (i = 0; i < bucket.record_count; i++) {
				memcpy(&record_status, records + record_offset, sizeof(record_status));
				memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
				memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

				insert_hash_key = insert_hash_to_bucket(record_key, linear_hash);

				split_hash_key	= hash_to_bucket(record_key, linear_hash);

				/* if the record is not a tombstone and h0(k) != h1(k) */
				if ((record_status == linear_hash_record_status_full) && (insert_hash_key != split_hash_key)) {
					/* delete all records with this key from the table */
					status = linear_hash_delete(record_key, linear_hash);

					if (status.error != err_ok) {
						return status.error;
					}

					int num_deleted = status.count;

					linear_hash->last_cache_idx = 0;

					/* insert that many records into the table */
					for (j = 0; j < num_deleted; j++) {
						memcpy(record_value, linear_hash->cache + linear_hash->last_cache_idx * linear_hash->super.record.value_size, linear_hash->super.record.value_size);
						linear_hash->last_cache_idx++;

						status = linear_hash_insert(record_key, record_value, hash_to_bucket(record_key, linear_hash), linear_hash);

						if (status.error != err_ok) {
							return status.error;
						}
					}

					/* refresh cached data and restart iteration and offset tracker */
					fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
					fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);
					status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);
					i				= -1;
					record_offset	= -1 * linear_hash->record_total_size;
				}

				/* track offset from locations of records in memory the next record is at */
				record_offset += linear_hash->record_total_size;
			}

			/* reset offset */
			record_offset = 0;
		}

		if (bucket.overflow_location == linear_hash_end_of_list) {
			terminal = boolean_true;
		}
		else {
			bucket_loc		= bucket.overflow_location;
			status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

			if (status.error != err_ok) {
				return status.error;
			}
		}
	}

	return linear_hash_increment_next_split(linear_hash);
}